

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
opt_dereferenceOperator_Test::~opt_dereferenceOperator_Test(opt_dereferenceOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(opt, dereferenceOperator)
{
  weekday::underlying_type d{1};
  opt<weekday> w{d};
  EXPECT_TRUE(w);
  EXPECT_TRUE(w.has_value());
  EXPECT_EQ(d, *w);
  EXPECT_EQ(d, w.value());
  EXPECT_EQ(d, w->get());
  EXPECT_EQ(d, w.value_or(weekday::underlying_type{3}));
}